

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidSchema.cc
# Opt level: O2

void __thiscall avro::ValidSchema::ValidSchema(ValidSchema *this)

{
  Schema SStack_28;
  
  NullSchema::NullSchema((NullSchema *)&SStack_28);
  (this->root_).px = SStack_28.node_.px;
  (this->root_).pn.pi_ = SStack_28.node_.pn.pi_;
  if (SStack_28.node_.pn.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (SStack_28.node_.pn.pi_)->use_count_ = (SStack_28.node_.pn.pi_)->use_count_ + 1;
    UNLOCK();
  }
  Schema::~Schema(&SStack_28);
  validate(&this->root_);
  return;
}

Assistant:

ValidSchema::ValidSchema() : root_(NullSchema().root()) 
{
    validate(root_);
}